

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O0

string * extract_generic_stream_partition_payload
                   (string *in_filename,ui32_t sid,string *out_filename,
                   IFileReaderFactory *fileReaderFactory)

{
  int iVar1;
  uint *puVar2;
  IFileReaderFactory *in_R8;
  Result_t local_1f0 [104];
  string local_188 [108];
  undefined4 local_11c;
  FileWriter local_118 [4];
  ui32_t write_count;
  FileWriter writer;
  Result_t local_e0 [107];
  undefined1 local_75;
  MXFReader local_68 [8];
  MXFReader reader;
  FrameBuffer local_58 [8];
  FrameBuffer payload;
  IFileReaderFactory *fileReaderFactory_local;
  string *out_filename_local;
  ui32_t sid_local;
  string *in_filename_local;
  Result_t *result;
  
  ASDCP::FrameBuffer::FrameBuffer(local_58);
  AS_02::ISXD::MXFReader::MXFReader(local_68,in_R8);
  local_75 = 0;
  AS_02::ISXD::MXFReader::OpenRead((string *)in_filename);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)in_filename);
  if (-1 < iVar1) {
    AS_02::ISXD::MXFReader::ReadGenericStreamPartitionPayload
              ((uint)local_e0,(FrameBuffer *)local_68);
    Kumu::Result_t::operator=((Result_t *)in_filename,local_e0);
    Kumu::Result_t::~Result_t(local_e0);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)in_filename);
  if (-1 < iVar1) {
    Kumu::FileWriter::FileWriter(local_118);
    local_11c = 0;
    Kumu::FileWriter::OpenWrite(local_188);
    Kumu::Result_t::operator=((Result_t *)in_filename,(Result_t *)local_188);
    Kumu::Result_t::~Result_t((Result_t *)local_188);
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)in_filename);
    if (-1 < iVar1) {
      puVar2 = (uint *)ASDCP::FrameBuffer::RoData(local_58);
      ASDCP::FrameBuffer::Size(local_58);
      Kumu::FileWriter::Write((uchar *)local_1f0,(uint)local_118,puVar2);
      Kumu::Result_t::operator=((Result_t *)in_filename,local_1f0);
      Kumu::Result_t::~Result_t(local_1f0);
    }
    Kumu::FileWriter::~FileWriter(local_118);
  }
  local_75 = 1;
  AS_02::ISXD::MXFReader::~MXFReader(local_68);
  ASDCP::FrameBuffer::~FrameBuffer(local_58);
  return in_filename;
}

Assistant:

Result_t
extract_generic_stream_partition_payload(const std::string& in_filename, const ui32_t sid, const std::string& out_filename, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  ASDCP::FrameBuffer payload;
  AS_02::ISXD::MXFReader reader(fileReaderFactory);

  Result_t result = reader.OpenRead(in_filename);
          
  if ( KM_SUCCESS(result) )
    {
      result = reader.ReadGenericStreamPartitionPayload(sid, payload);
    }
  
  if ( KM_SUCCESS(result) )
    {
      Kumu::FileWriter writer;
      ui32_t write_count = 0;
      result = writer.OpenWrite(out_filename);
      
      if ( KM_SUCCESS(result) )
	{
	  result = writer.Write(payload.RoData(), payload.Size(), &write_count);
	}
    }

  return result;
}